

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::equality(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_90 [48];
  undefined1 local_60 [80];
  Parser *this_local;
  ptr<Expression> *expr;
  
  local_60[0x47] = '\0';
  this_local = this;
  comparison(this);
  bVar1 = match(in_RSI,Equals);
  if (bVar1) {
    consume(in_RSI);
    make<Equality>();
    equality((Parser *)local_60);
    make<BinaryOperator,std::shared_ptr<Equality>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
              ((shared_ptr<Equality> *)(local_60 + 0x20),(shared_ptr<Expression> *)(local_60 + 0x10)
               ,(shared_ptr<Expression> *)this);
    std::shared_ptr<Expression>::operator=
              ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_60);
    std::shared_ptr<Equality>::~shared_ptr((shared_ptr<Equality> *)(local_60 + 0x10));
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match(in_RSI,NotEqu);
    _Var2._M_pi = extraout_RDX_00;
    if (bVar1) {
      consume(in_RSI);
      make<Inequality>();
      equality((Parser *)local_90);
      make<BinaryOperator,std::shared_ptr<Inequality>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                ((shared_ptr<Inequality> *)(local_90 + 0x20),
                 (shared_ptr<Expression> *)(local_90 + 0x10),(shared_ptr<Expression> *)this);
      std::shared_ptr<Expression>::operator=
                ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_90 + 0x20));
      std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_90 + 0x20));
      std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_90);
      std::shared_ptr<Inequality>::~shared_ptr((shared_ptr<Inequality> *)(local_90 + 0x10));
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::equality() {
    ptr<Expression> expr = comparison();

    if(match(TokenType::Equals)) {
        consume();
        expr = make<BinaryOperator>(make<Equality>(), expr, equality());
    }else if(match(TokenType::NotEqu)) {
        consume();
        expr = make<BinaryOperator>(make<Inequality>(), expr, equality());
    }

    return expr;
}